

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferActiveUniformValidation.cpp
# Opt level: O0

void __thiscall
glcts::TextureBufferActiveUniformValidation::addTextureParam
          (TextureBufferActiveUniformValidation *this,GLenum uniformType,GLenum format,GLuint size,
          char *name,
          vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_> *params)

{
  undefined1 local_60 [8];
  TextureParameters texParam;
  vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_> *params_local;
  char *name_local;
  GLuint size_local;
  GLenum format_local;
  GLenum uniformType_local;
  TextureBufferActiveUniformValidation *this_local;
  
  texParam.m_uniform_name.field_2._8_8_ = params;
  TextureParameters::TextureParameters((TextureParameters *)local_60,size,format,uniformType,name);
  std::vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>::push_back
            ((vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_> *)
             texParam.m_uniform_name.field_2._8_8_,(TextureParameters *)local_60);
  TextureParameters::~TextureParameters((TextureParameters *)local_60);
  return;
}

Assistant:

void TextureBufferActiveUniformValidation::addTextureParam(glw::GLenum uniformType, glw::GLenum format,
														   glw::GLuint size, const char* name,
														   std::vector<TextureParameters>* params)
{
	TextureParameters texParam(size, format, uniformType, name);
	params->push_back(texParam);
}